

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O1

EStatusCode __thiscall
AbstractContentContext::SCN
          (AbstractContentContext *this,double *inColorComponents,int inColorComponentsLength,
          string *inPatternName)

{
  EStatusCode EVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  string local_50;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddProcsetResource
            ((ResourcesDictionary *)CONCAT44(extraout_var,iVar2),&KProcsetPDF_abi_cxx11_);
  if (0 < inColorComponentsLength) {
    uVar3 = 0;
    do {
      PrimitiveObjectsWriter::WriteDouble
                (&this->mPrimitiveWriter,inColorComponents[uVar3],eTokenSeparatorSpace);
      uVar3 = uVar3 + 1;
    } while ((uint)inColorComponentsLength != uVar3);
  }
  PrimitiveObjectsWriter::WriteName(&this->mPrimitiveWriter,inPatternName,eTokenSeparatorSpace);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SCN","");
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::SCN(double* inColorComponents, int inColorComponentsLength,const std::string& inPatternName)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	for(int i=0;i<inColorComponentsLength;++i)
		mPrimitiveWriter.WriteDouble(inColorComponents[i]);
	mPrimitiveWriter.WriteName(inPatternName);
	mPrimitiveWriter.WriteKeyword("SCN");
	return GetCurrentStatusCode();
}